

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<std::__cxx11::string&,char_const(&)[24]>
          (string *__return_storage_ptr__,util *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [24])

{
  ostringstream ss;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  std::operator<<((ostream *)aoStack_198,(string *)this);
  std::operator<<((ostream *)aoStack_198,(char *)args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}